

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     UniversalPrint<std::tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct&>>
               (tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&> *value,
               ostream *os)

{
  simple_struct *value_00;
  ostream *poVar1;
  
  std::operator<<(os,"(");
  value_00 = (value->
             super__Tuple_impl<0UL,_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>).
             super__Head_base<0UL,_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&,_false>
             ._M_head_impl;
  poVar1 = std::operator<<(os,"@");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1," ");
  UniversalPrint<(anonymous_namespace)::SerializeSpanFallback::simple_struct>(value_00,os);
  std::operator<<(os,")");
  return;
}

Assistant:

void UniversalPrint(const T& value, ::std::ostream* os) {
  // A workarond for the bug in VC++ 7.1 that prevents us from instantiating
  // UniversalPrinter with T directly.
  typedef T T1;
  UniversalPrinter<T1>::Print(value, os);
}